

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ave_u_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = (ulong)wd * 0x10;
  lVar5 = (ulong)ws * 0x10;
  lVar4 = (ulong)wt * 0x10;
  uVar1 = *(ushort *)((env->active_fpu).fpr + ws);
  uVar2 = *(ushort *)((env->active_fpu).fpr + wt);
  *(ushort *)((env->active_fpu).fpr + wd) = (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 2);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 2);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 2) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 4);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 4);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 4) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 6);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 6);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 6) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 8);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 8);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 8) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 10);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 10);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 10) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 0xc);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xc) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + lVar5 + 0xe);
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 + 0xe);
  *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xe) =
       (uVar1 & uVar2 & 1) + (uVar2 >> 1) + (uVar1 >> 1);
  return;
}

Assistant:

void helper_msa_ave_u_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_ave_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_ave_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_ave_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_ave_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_ave_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_ave_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_ave_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_ave_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}